

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildAsmSimdTypedArr
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,uint32 slotIndex,RegSlot value,
          ViewType viewType,uint8 dataWidth,uint32 simdOffset)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  RegSlot srcRegSlot;
  RegSlot srcRegSlot_00;
  undefined4 *puVar5;
  RegOpnd *src2Opnd;
  RegOpnd *baseOpnd_00;
  RegOpnd *pRVar6;
  RegOpnd *baseOpnd;
  IndirOpnd *indirOpnd;
  RegOpnd *regOpnd;
  Instr *instr;
  RegSlot indexRegSlot;
  Opnd *sizeOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  OpCode local_32;
  bool isConst;
  bool isLd;
  ValueType arrayType;
  RegOpnd *pRStack_30;
  OpCode op;
  RegOpnd *addrOpnd;
  RegSlot valueRegSlot;
  IRType type;
  ViewType viewType_local;
  RegSlot value_local;
  uint32 slotIndex_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  addrOpnd._6_1_ = TySimd128F4;
  srcRegSlot = GetRegSlotFromSimd128Reg(this,value);
  pRStack_30 = (RegOpnd *)0x0;
  local_32 = GetSimdOpcode(this,newOpcode);
  ValueType::ValueType((ValueType *)&local_34.field_0);
  bVar2 = false;
  bVar4 = false;
  switch(newOpcode) {
  case Simd128_LdArr_I16:
    bVar2 = true;
    bVar4 = false;
    addrOpnd._6_1_ = TySimd128I16;
    break;
  case Simd128_LdArrConst_I16:
    bVar2 = true;
    bVar4 = true;
    addrOpnd._6_1_ = TySimd128I16;
    break;
  case Simd128_StArr_I16:
    bVar2 = false;
    bVar4 = false;
    addrOpnd._6_1_ = TySimd128I16;
    break;
  case Simd128_StArrConst_I16:
    bVar2 = false;
    bVar4 = true;
    addrOpnd._6_1_ = TySimd128I16;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x1b12,"((0))","UNREACHED");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    break;
  case Simd128_LdArr_I4:
    bVar2 = true;
    bVar4 = false;
    addrOpnd._6_1_ = TySimd128I4;
    break;
  case Simd128_LdArrConst_I4:
    bVar2 = true;
    bVar4 = true;
    addrOpnd._6_1_ = TySimd128I4;
    break;
  case Simd128_LdArr_F4:
    bVar2 = true;
    bVar4 = false;
    addrOpnd._6_1_ = TySimd128F4;
    break;
  case Simd128_LdArrConst_F4:
    bVar2 = true;
    bVar4 = true;
    addrOpnd._6_1_ = TySimd128F4;
    break;
  case Simd128_StArr_I4:
    bVar2 = false;
    bVar4 = false;
    addrOpnd._6_1_ = TySimd128I4;
    break;
  case Simd128_StArrConst_I4:
    bVar2 = false;
    addrOpnd._6_1_ = TySimd128I4;
    bVar4 = true;
    break;
  case Simd128_StArr_F4:
    bVar2 = false;
    bVar4 = false;
    addrOpnd._6_1_ = TySimd128F4;
    break;
  case Simd128_StArrConst_F4:
    bVar2 = false;
    bVar4 = true;
    addrOpnd._6_1_ = TySimd128F4;
    break;
  case Simd128_LdArr_I8:
    bVar2 = true;
    bVar4 = false;
    addrOpnd._6_1_ = TySimd128I8;
    break;
  case Simd128_LdArrConst_I8:
    bVar2 = true;
    bVar4 = true;
    addrOpnd._6_1_ = TySimd128I8;
    break;
  case Simd128_StArr_I8:
    bVar2 = false;
    bVar4 = false;
    addrOpnd._6_1_ = TySimd128I8;
    break;
  case Simd128_StArrConst_I8:
    bVar2 = false;
    bVar4 = true;
    addrOpnd._6_1_ = TySimd128I8;
    break;
  case Simd128_LdArr_U4:
    bVar2 = true;
    bVar4 = false;
    addrOpnd._6_1_ = TySimd128U4;
    break;
  case Simd128_LdArrConst_U4:
    bVar2 = true;
    bVar4 = true;
    addrOpnd._6_1_ = TySimd128U4;
    break;
  case Simd128_StArr_U4:
    bVar2 = false;
    bVar4 = false;
    addrOpnd._6_1_ = TySimd128U4;
    break;
  case Simd128_StArrConst_U4:
    bVar2 = false;
    bVar4 = true;
    addrOpnd._6_1_ = TySimd128U4;
    break;
  case Simd128_LdArr_U8:
    bVar2 = true;
    bVar4 = false;
    addrOpnd._6_1_ = TySimd128U8;
    break;
  case Simd128_LdArrConst_U8:
    bVar2 = true;
    bVar4 = true;
    addrOpnd._6_1_ = TySimd128U8;
    break;
  case Simd128_StArr_U8:
    bVar2 = false;
    bVar4 = false;
    addrOpnd._6_1_ = TySimd128U8;
    break;
  case Simd128_StArrConst_U8:
    bVar2 = false;
    bVar4 = true;
    addrOpnd._6_1_ = TySimd128U8;
    break;
  case Simd128_LdArr_U16:
    bVar2 = true;
    bVar4 = false;
    addrOpnd._6_1_ = TySimd128U16;
    break;
  case Simd128_LdArrConst_U16:
    bVar2 = true;
    bVar4 = true;
    addrOpnd._6_1_ = TySimd128U16;
    break;
  case Simd128_StArr_U16:
    bVar2 = false;
    bVar4 = false;
    addrOpnd._6_1_ = TySimd128U16;
    break;
  case Simd128_StArrConst_U16:
    bVar2 = false;
    bVar4 = true;
    addrOpnd._6_1_ = TySimd128U16;
  }
  switch(viewType) {
  case TYPE_INT8:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Int8Array);
    break;
  case TYPE_UINT8:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Uint8Array);
    break;
  case TYPE_INT16:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Int16Array);
    break;
  case TYPE_UINT16:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Uint16Array);
    break;
  case TYPE_INT32:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Int32Array);
    break;
  case TYPE_UINT32:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Uint32Array);
    break;
  case TYPE_FLOAT32:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Float32Array);
    break;
  case TYPE_FLOAT64:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Float64Array);
    break;
  case TYPE_INT64:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Int64Array);
    break;
  case TYPE_INT8_TO_INT64:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Int8Array);
    break;
  case TYPE_UINT8_TO_INT64:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Uint8Array);
    break;
  case TYPE_INT16_TO_INT64:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Int16Array);
    break;
  case TYPE_UINT16_TO_INT64:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Uint16Array);
    break;
  case TYPE_INT32_TO_INT64:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Int32Array);
    break;
  case TYPE_UINT32_TO_INT64:
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Uint32Array);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x1b1d,"((0))","UNREACHED");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  src2Opnd = BuildSrcOpnd(this,5,TyUint32);
  if (!bVar4) {
    srcRegSlot_00 = GetRegSlotFromIntReg(this,slotIndex);
    pRStack_30 = BuildSrcOpnd(this,srcRegSlot_00,TyInt32);
  }
  baseOpnd_00 = BuildSrcOpnd(this,4,TyVar);
  IR::Opnd::SetValueType(&baseOpnd_00->super_Opnd,(ValueType)local_34.field_0);
  IR::Opnd::SetValueTypeFixed(&baseOpnd_00->super_Opnd);
  if (bVar2) {
    pRVar6 = BuildDstOpnd(this,srcRegSlot,addrOpnd._6_1_);
    IR::Opnd::SetValueType(&pRVar6->super_Opnd,ValueType::Simd);
    if (bVar4) {
      baseOpnd = (RegOpnd *)
                 IR::IndirOpnd::New(baseOpnd_00,slotIndex,addrOpnd._6_1_,this->m_func,false);
    }
    else {
      if (pRStack_30 == (RegOpnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x1b35,"(addrOpnd)","addrOpnd");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      baseOpnd = (RegOpnd *)IR::IndirOpnd::New(baseOpnd_00,pRStack_30,addrOpnd._6_1_,this->m_func);
    }
    regOpnd = (RegOpnd *)
              IR::Instr::New(local_32,&pRVar6->super_Opnd,&baseOpnd->super_Opnd,
                             &src2Opnd->super_Opnd,this->m_func);
  }
  else {
    pRVar6 = BuildSrcOpnd(this,srcRegSlot,addrOpnd._6_1_);
    IR::Opnd::SetValueType(&pRVar6->super_Opnd,ValueType::Simd);
    if (bVar4) {
      baseOpnd = (RegOpnd *)
                 IR::IndirOpnd::New(baseOpnd_00,slotIndex,addrOpnd._6_1_,this->m_func,false);
    }
    else {
      if (pRStack_30 == (RegOpnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x1b4a,"(addrOpnd)","addrOpnd");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      baseOpnd = (RegOpnd *)IR::IndirOpnd::New(baseOpnd_00,pRStack_30,addrOpnd._6_1_,this->m_func);
    }
    regOpnd = (RegOpnd *)
              IR::Instr::New(local_32,&baseOpnd->super_Opnd,&pRVar6->super_Opnd,
                             &src2Opnd->super_Opnd,this->m_func);
  }
  if ((dataWidth < 4) || (0x10 < dataWidth)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x1b5a,"(dataWidth >= 4 && dataWidth <= 16)",
                       "dataWidth >= 4 && dataWidth <= 16");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  *(uint8 *)((long)&regOpnd[1].m_sym + 3) = dataWidth;
  IR::IndirOpnd::SetOffset((IndirOpnd *)baseOpnd,simdOffset,false);
  AddInstr(this,(Instr *)regOpnd,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildAsmSimdTypedArr(Js::OpCodeAsmJs newOpcode, uint32 offset, uint32 slotIndex, Js::RegSlot value, Js::ArrayBufferView::ViewType viewType, uint8 dataWidth, uint32 simdOffset)
{
    IRType type = TySimd128F4;
    Js::RegSlot valueRegSlot = GetRegSlotFromSimd128Reg(value);

    IR::RegOpnd * addrOpnd = nullptr;

    Js::OpCode op = GetSimdOpcode(newOpcode);
    ValueType arrayType;
    bool isLd = false, isConst = false;

    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Simd128_LdArr_I4:
        isLd = true;
        isConst = false;
        type = TySimd128I4;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArr_I8:
        isLd = true;
        isConst = false;
        type = TySimd128I8;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArr_I16:
        isLd = true;
        isConst = false;
        type = TySimd128I16;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArr_U4:
        isLd = true;
        isConst = false;
        type = TySimd128U4;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArr_U8:
        isLd = true;
        isConst = false;
        type = TySimd128U8;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArr_U16:
        isLd = true;
        isConst = false;
        type = TySimd128U16;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArr_F4:
        isLd = true;
        isConst = false;
        type = TySimd128F4;
        break;
#if 0
    case Js::OpCodeAsmJs::Simd128_LdArr_D2:
        isLd = true;
        isConst = false;
        type = TySimd128D2;
        break;
#endif // 0

    case Js::OpCodeAsmJs::Simd128_StArr_I4:
        isLd = false;
        isConst = false;
        type = TySimd128I4;
        break;
    case Js::OpCodeAsmJs::Simd128_StArr_I8:
        isLd = false;
        isConst = false;
        type = TySimd128I8;
        break;
    case Js::OpCodeAsmJs::Simd128_StArr_I16:
        isLd = false;
        isConst = false;
        type = TySimd128I16;
        break;
    case Js::OpCodeAsmJs::Simd128_StArr_U4:
        isLd = false;
        isConst = false;
        type = TySimd128U4;
        break;
    case Js::OpCodeAsmJs::Simd128_StArr_U8:
        isLd = false;
        isConst = false;
        type = TySimd128U8;
        break;
    case Js::OpCodeAsmJs::Simd128_StArr_U16:
        isLd = false;
        isConst = false;
        type = TySimd128U16;
        break;
    case Js::OpCodeAsmJs::Simd128_StArr_F4:
        isLd = false;
        isConst = false;
        type = TySimd128F4;
        break;
#if 0
    case Js::OpCodeAsmJs::Simd128_StArr_D2:
        isLd = false;
        isConst = false;
        type = TySimd128D2;
        break;
#endif // 0

    case Js::OpCodeAsmJs::Simd128_LdArrConst_I4:
        isLd = true;
        isConst = true;
        type = TySimd128I4;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArrConst_I8:
        isLd = true;
        isConst = true;
        type = TySimd128I8;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArrConst_I16:
        isLd = true;
        isConst = true;
        type = TySimd128I16;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArrConst_U4:
        isLd = true;
        isConst = true;
        type = TySimd128U4;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArrConst_U8:
        isLd = true;
        isConst = true;
        type = TySimd128U8;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArrConst_U16:
        isLd = true;
        isConst = true;
        type = TySimd128U16;
        break;
    case Js::OpCodeAsmJs::Simd128_LdArrConst_F4:
        isLd = true;
        isConst = true;
        type = TySimd128F4;
        break;
#if 0
    case Js::OpCodeAsmJs::Simd128_LdArrConst_D2:
        isLd = true;
        isConst = true;
        type = TySimd128D2;
        break;
#endif
    case Js::OpCodeAsmJs::Simd128_StArrConst_I4:
        isLd = false;
        type = TySimd128I4;
        isConst = true;
        break;
    case Js::OpCodeAsmJs::Simd128_StArrConst_I8:
        isLd = false;
        isConst = true;
        type = TySimd128I8;
        break;
    case Js::OpCodeAsmJs::Simd128_StArrConst_I16:
        isLd = false;
        isConst = true;
        type = TySimd128I16;
        break;
    case Js::OpCodeAsmJs::Simd128_StArrConst_U4:
        isLd = false;
        isConst = true;
        type = TySimd128U4;
        break;
    case Js::OpCodeAsmJs::Simd128_StArrConst_U8:
        isLd = false;
        isConst = true;
        type = TySimd128U8;
        break;
    case Js::OpCodeAsmJs::Simd128_StArrConst_U16:
        isLd = false;
        isConst = true;
        type = TySimd128U16;
        break;
    case Js::OpCodeAsmJs::Simd128_StArrConst_F4:
        isLd = false;
        isConst = true;
        type = TySimd128F4;
        break;
#if 0
    case Js::OpCodeAsmJs::Simd128_StArrConst_D2:
        isLd = false;
        isConst = true;
        type = TySimd128D2;
        break;
#endif
    default:
        Assert(UNREACHED);
    }

    switch (viewType)
    {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, irSuffix) \
    case Js::ArrayBufferView::TYPE_##name: \
        arrayType = ValueType::GetObject(ObjectType::##irSuffix##Array); \
        break;
#include "Language/AsmJsArrayBufferViews.h"
    default:
        Assert(UNREACHED);
    }

    IR::Opnd * sizeOpnd = BuildSrcOpnd(AsmJsRegSlots::LengthReg, TyUint32);
    if (!isConst)
    {

        Js::RegSlot indexRegSlot = GetRegSlotFromIntReg(slotIndex);
        addrOpnd = BuildSrcOpnd(indexRegSlot, TyInt32);
    }

    IR::Instr * instr = nullptr;
    IR::RegOpnd * regOpnd = nullptr;
    IR::IndirOpnd * indirOpnd = nullptr;
    IR::RegOpnd * baseOpnd = BuildSrcOpnd(AsmJsRegSlots::BufferReg, TyVar);
    baseOpnd->SetValueType(arrayType);
    baseOpnd->SetValueTypeFixed();

    if (isLd)
    {
        regOpnd = BuildDstOpnd(valueRegSlot, type);
        regOpnd->SetValueType(ValueType::Simd);
        if (!isConst)
        {
            Assert(addrOpnd);
            // Js::OpCodeAsmJs::Simd128_LdArr_I4:
            // Js::OpCodeAsmJs::Simd128_LdArr_F4:
            // Js::OpCodeAsmJs::Simd128_LdArr_D2:
            indirOpnd = IR::IndirOpnd::New(baseOpnd, addrOpnd, type, m_func);
        }
        else
        {
            // Js::OpCodeAsmJs::Simd128_LdArrConst_I4:
            // Js::OpCodeAsmJs::Simd128_LdArrConst_F4:
            // Js::OpCodeAsmJs::Simd128_LdArrConst_D2:
            indirOpnd = IR::IndirOpnd::New(baseOpnd, slotIndex, type, m_func);
        }
        instr = IR::Instr::New(op, regOpnd, indirOpnd, sizeOpnd, m_func);
    }
    else
    {
        regOpnd = BuildSrcOpnd(valueRegSlot, type);
        regOpnd->SetValueType(ValueType::Simd);
        if (!isConst)
        {
            Assert(addrOpnd);
            // Js::OpCodeAsmJs::Simd128_StArr_I4:
            // Js::OpCodeAsmJs::Simd128_StArr_F4:
            // Js::OpCodeAsmJs::Simd128_StArr_D2:
            indirOpnd = IR::IndirOpnd::New(baseOpnd, addrOpnd, type, m_func);
        }
        else
        {
            // Js::OpCodeAsmJs::Simd128_StArrConst_I4:
            // Js::OpCodeAsmJs::Simd128_StArrConst_F4:
            // Js::OpCodeAsmJs::Simd128_StArrConst_D2:
            indirOpnd = IR::IndirOpnd::New(baseOpnd, slotIndex, type, m_func);
        }
        instr = IR::Instr::New(op, indirOpnd, regOpnd, sizeOpnd, m_func);
    }
    // REVIEW: Store dataWidth in the instruction itself instead of an argument to avoid using ExtendedArgs or excessive opcodes.
    Assert(dataWidth >= 4 && dataWidth <= 16);
    instr->dataWidth = dataWidth;
    indirOpnd->SetOffset(simdOffset);
    AddInstr(instr, offset);

}